

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O3

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
::resize_buffer(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
                *this,size_type size)

{
  ulong *puVar1;
  ulong uVar2;
  pointer_type __src;
  bool bVar3;
  ulong *puVar4;
  char *__dest;
  undefined8 uVar5;
  ulong *puVar6;
  ulong uVar7;
  size_type sVar8;
  ulong uVar9;
  pointer_type pcVar10;
  long lVar11;
  char *new_buffer;
  size_t new_buffer_size;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
  deallocate_buffer;
  sizes_t prev_sizes;
  char *local_a8;
  size_t local_a0;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
  local_98;
  buffer_t<char> local_78;
  flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  local_60;
  sizes_t local_40;
  
  buffer_t<char>::validate((buffer_t<char> *)this);
  get_all_sizes(&local_40,this);
  local_a8 = (char *)0x0;
  local_98.super_anon_class_24_3_566c83a5.buffer_size = &local_a0;
  local_a0 = 0;
  local_98.armed_ = true;
  local_98.super_anon_class_24_3_566c83a5.this =
       (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
        *)this;
  if (local_40.total_capacity < size) {
    if ((long)size < 0) {
LAB_001095fc:
      local_98.super_anon_class_24_3_566c83a5.buffer = &local_a8;
      uVar5 = std::__throw_bad_alloc();
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/vladp72[P]iffl/include/iffl_list.h:5640:33)>
      ::discharge(&local_98);
      _Unwind_Resume(uVar5);
    }
    local_98.super_anon_class_24_3_566c83a5.buffer = &local_a8;
    __dest = (char *)operator_new(size);
    local_a8 = __dest;
    local_a0 = size;
    if ((this->buffer_).v2_.last != (pointer_type)0x0) {
      memcpy(__dest,(this->buffer_).v2_.begin,local_40.last_element.super_range.data_end);
      pcVar10 = __dest + local_40.last_element.super_range.buffer_begin;
      goto LAB_001095b8;
    }
  }
  else {
    if (size == 0) {
      local_98.super_anon_class_24_3_566c83a5.buffer = &local_a8;
      clear(this);
      goto LAB_001095d3;
    }
    local_98.super_anon_class_24_3_566c83a5.buffer = &local_a8;
    if (local_40.total_capacity <= size) goto LAB_001095d3;
    if ((long)size < 0) goto LAB_001095fc;
    local_98.super_anon_class_24_3_566c83a5.buffer = &local_a8;
    local_a8 = (char *)operator_new(size);
    if (size < local_40.last_element.super_range.data_end) {
      puVar1 = (ulong *)(this->buffer_).v2_.begin;
      local_a0 = size;
      if (puVar1 == (ulong *)0x0) {
LAB_0010955d:
        std::terminate();
      }
      local_78.end = (pointer_type)((long)puVar1 + size);
      if (size < 0x18) {
        bVar3 = false;
        local_78.last = (pointer_type)(ulong *)0x0;
      }
      else {
        local_78.last = (pointer_type)(ulong *)0x0;
        puVar4 = puVar1;
        sVar8 = size;
        do {
          puVar6 = puVar4;
          uVar2 = *puVar6;
          uVar7 = sVar8 - uVar2;
          if (sVar8 < uVar2) {
LAB_00109500:
            bVar3 = false;
            goto LAB_00109510;
          }
          uVar9 = puVar6[2] + 0x18;
          if (uVar2 == 0) {
            bVar3 = uVar9 <= sVar8;
            if (uVar9 <= sVar8) {
              local_78.last = (pointer_type)puVar6;
            }
            goto LAB_00109510;
          }
          if (uVar2 < uVar9) goto LAB_00109500;
          local_78.last = (pointer_type)puVar6;
          puVar4 = (ulong *)(uVar2 + (long)puVar6);
          sVar8 = uVar7;
        } while (0x17 < uVar7);
        bVar3 = false;
      }
LAB_00109510:
      local_78.begin = (pointer_type)puVar1;
      buffer_t<char>::validate(&local_78);
      local_60.buffer_.begin._7_1_ = SUB81(local_78.begin,0);
      local_60.buffer_.last._0_7_ = (undefined7)((ulong)local_78.begin >> 8);
      local_60.buffer_._15_8_ = local_78.last;
      if (bVar3) {
        flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
        ::last(&local_60);
        if ((pointer_type)CONCAT17(local_60.buffer_.begin._7_1_,local_60.buffer_.begin._0_7_) !=
            (this->buffer_).v2_.last) goto LAB_0010955d;
      }
      else {
        flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
        ::last(&local_60);
        if ((pointer_type)CONCAT17(local_60.buffer_.begin._7_1_,local_60.buffer_.begin._0_7_) ==
            (this->buffer_).v2_.last) goto LAB_0010955d;
      }
      flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::last(&local_60);
      pcVar10 = (pointer_type)CONCAT17(local_60.buffer_.begin._7_1_,local_60.buffer_.begin._0_7_);
    }
    else {
      pcVar10 = (this->buffer_).v2_.last;
      local_a0 = size;
    }
    if (pcVar10 == (pointer_type)0x0) {
      pcVar10 = (pointer_type)0x0;
    }
    else {
      __src = (this->buffer_).v2_.begin;
      lVar11 = (long)pcVar10 - (long)__src;
      pcVar10[0] = '\0';
      pcVar10[1] = '\0';
      pcVar10[2] = '\0';
      pcVar10[3] = '\0';
      pcVar10[4] = '\0';
      pcVar10[5] = '\0';
      pcVar10[6] = '\0';
      pcVar10[7] = '\0';
      memcpy(local_a8,__src,*(long *)(pcVar10 + 0x10) + lVar11 + 0x18);
      pcVar10 = local_a8 + lVar11;
    }
LAB_001095b8:
    (this->buffer_).v2_.last = pcVar10;
  }
  commit_new_buffer(this,&local_a8,&local_a0);
  (this->buffer_).v2_.end = (this->buffer_).v2_.begin + size;
LAB_001095d3:
  buffer_t<char>::validate((buffer_t<char> *)this);
  validate_data_invariants(this);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/vladp72[P]iffl/include/iffl_list.h:5640:33)>
  ::discharge(&local_98);
  return;
}

Assistant:

void resize_buffer(size_type size) {
        validate_pointer_invariants();

        sizes_t const prev_sizes{ get_all_sizes() };

        char *new_buffer{ nullptr };
        size_t new_buffer_size{ 0 };
        auto deallocate_buffer{ make_scoped_deallocator(&new_buffer, &new_buffer_size) };
        //
        // growing capacity
        //
        if (prev_sizes.total_capacity < size) {
            new_buffer = allocate_buffer(size);
            new_buffer_size = size;
            if (nullptr != buff().last) {
                copy_data(new_buffer, buff().begin, prev_sizes.used_capacity().size);
                buff().last = new_buffer + prev_sizes.last_element.begin();
            }
            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        //
        // shrinking to 0 is simple
        //
        } else if (0 == size) {
            clear();
        //
        // to shrink to a smaller size we first need to 
        // find last element that would completely fit 
        // in the new buffer, and if we found any, then
        // make it new last element. If we did not find 
        // any, then designate that there are no last 
        // element
        //
        } else if (prev_sizes.total_capacity > size) {

            new_buffer = allocate_buffer(size);
            new_buffer_size = size;

            bool is_valid{ true };
            char *last_valid{ buff().last };
            //
            // If we are shrinking below used capacity then last element will
            // be removed, and we need to do linear search for the new last element 
            // that would fit new buffer size.
            //
            if (prev_sizes.used_capacity().size > size) {
                flat_forward_list_ref<T, TT> buffer_view;
                std::tie(is_valid, buffer_view) = flat_forward_list_validate<T, TT>(buff().begin,
                                                                                    buff().begin + size);
                if (is_valid) {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() == buff().last);
                } else {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() != buff().last);
                }
                last_valid = buffer_view.last().get_ptr();
            }

            if (last_valid) {
                size_type new_last_element_offset = last_valid - buff().begin;

                size_with_padding_t const last_valid_element_size{ traits_traits::get_size(last_valid) };
                size_type const new_used_capacity{ new_last_element_offset + last_valid_element_size.size };
                
                set_no_next_element(last_valid);
                
                copy_data(new_buffer, buff().begin, new_used_capacity);
                buff().last = new_buffer + new_last_element_offset;
            } else {
                buff().last = nullptr;
            }

            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        }

        validate_pointer_invariants();
        validate_data_invariants();
    }